

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
InterpreterTest_GlobalInitI32_Test::TestBody(InterpreterTest_GlobalInitI32_Test *this)

{
  pointer *ppuVar1;
  pointer pLVar2;
  Const *pCVar3;
  Const *pCVar4;
  undefined1 *puVar5;
  char *pcVar6;
  pointer *__ptr;
  undefined1 auVar7 [16];
  initializer_list<wasm::Literal> __l;
  Name NVar8;
  Name NVar9;
  pointer local_1e0;
  IRBuilder irBuilder;
  pointer local_138;
  element_type *local_130;
  undefined1 local_128 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  shared_ptr<wasm::Module> wasm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  undefined8 local_f0;
  Builder local_e8;
  Builder builder;
  Result<wasm::Expression_*> expr;
  __index_type local_c0;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  Result<wasm::Ok> result;
  Message local_88;
  undefined1 local_80 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  Interpreter interpreter;
  
  expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wasm::Module,std::allocator<wasm::Module>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm,
             (Module **)
             &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(allocator<wasm::Module> *)&local_1e0);
  pLVar2 = expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_e8.wasm =
       (Module *)
       expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1e0 = expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  irBuilder.wasm = (Module *)0x0;
  irBuilder.func =
       (Function *)
       expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  irBuilder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._M_u._12_1_ = 0;
  irBuilder.debugLoc.
  super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  .
  super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
  ._16_8_ = 0;
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  irBuilder.scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&irBuilder.labelDepths._M_h._M_rehash_policy._M_next_resize;
  irBuilder.builder.wasm = (Module *)0x0;
  irBuilder.binaryPos = (size_t *)0x0;
  irBuilder.lastBinaryPos = 0;
  irBuilder.labelDepths._M_h._M_buckets = (__buckets_ptr)0x1;
  irBuilder.labelDepths._M_h._M_bucket_count = 0;
  irBuilder.labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  irBuilder.labelDepths._M_h._M_element_count._0_4_ = 0x3f800000;
  irBuilder.labelDepths._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  irBuilder.labelDepths._M_h._M_rehash_policy._4_4_ = 0;
  irBuilder.labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  irBuilder.labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  auVar7 = ::wasm::IString::interned(6,"global",0);
  irBuilder._152_8_ = auVar7._0_8_;
  pCVar3 = ::wasm::Builder::makeConst<int>(&local_e8,2);
  pCVar4 = ::wasm::Builder::makeConst<int>(&local_e8,3);
  puVar5 = (undefined1 *)MixedArena::allocSpace(&(local_e8.wasm)->allocator,0x28,8);
  *puVar5 = 0x10;
  *(undefined8 *)(puVar5 + 8) = 0;
  *(undefined4 *)(puVar5 + 0x10) = 0;
  *(Const **)(puVar5 + 0x18) = pCVar3;
  *(Const **)(puVar5 + 0x20) = pCVar4;
  ::wasm::Binary::finalize();
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x50);
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2].type.id = 0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[3].field_0.i64 = 0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2].field_0.i64 = 0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].type.id = 0;
  ((results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->type).id = 0;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[1].field_0.i64 = 0;
  ((results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->field_0).i64 = irBuilder._152_8_;
  ((results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage)->field_0).func.super_IString.str._M_str =
       auVar7._8_8_;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2].field_0.func.super_IString.str._M_str = (char *)0x2;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[2].type.id = (uintptr_t)puVar5;
  results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage[3].field_0.v128[0] = '\x01';
  ::wasm::Module::addGlobal((unique_ptr *)pLVar2);
  if (results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x50);
  }
  pcVar6 = (char *)0x2;
  NVar8.super_IString.str._M_str = (char *)&local_1e0;
  NVar8.super_IString.str._M_len =
       (size_t)&results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  ::wasm::IRBuilder::makeBlock(NVar8,(Signature)ZEXT816(0));
  builder.wasm._0_1_ =
       (char)interpreter.store.instances.
             super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
             ._M_impl.super__Vector_impl_data._M_start != '\x01';
  _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
             &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((char)builder.wasm == '\0') {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)&builder,
               (AssertionResult *)
               "irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr()","true",
               "false",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x3be,(char *)results.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b0);
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            _expr);
    }
    ::wasm::IString::interned(6,"global",0);
    NVar9.super_IString.str._M_str = (char *)&local_1e0;
    NVar9.super_IString.str._M_len =
         (size_t)&results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    ::wasm::IRBuilder::makeGlobalGet(NVar9);
    builder.wasm._0_1_ =
         (char)interpreter.store.instances.
               super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
               ._M_impl.super__Vector_impl_data._M_start != '\x01';
    _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((char)builder.wasm == '\0') {
      testing::Message::Message((Message *)local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)&builder,
                 (AssertionResult *)"irBuilder.makeGlobalGet(\"global\").getErr()","true","false",
                 pcVar6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x3bf,(char *)results.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b0);
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _expr);
      }
      ::wasm::IRBuilder::visitEnd();
      builder.wasm._0_1_ =
           (char)interpreter.store.instances.
                 super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_start != '\x01';
      _expr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if ((char)builder.wasm != '\0') {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_expr);
        }
        ::wasm::IRBuilder::build();
        local_b0[0] = local_c0 != '\x01';
        _result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_c0 == '\x01') {
          testing::Message::Message((Message *)local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_b0,
                     (AssertionResult *)"expr.getErr()","true","false",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x3c3,(char *)results.
                                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_128,(Message *)local_80);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_128);
          if (results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage !=
              (pointer)&interpreter.store.callStack.
                        super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            operator_delete(results.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)(interpreter.store.callStack.
                                    super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 1));
          }
          if (local_80 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_80 + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_result !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&result,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _result);
          }
        }
        else {
          interpreter.store.instances.
          super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          interpreter.store.instances.
          super__Vector_base<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          interpreter.store.callStack.
          super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_138 = expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_130 = wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ppuVar1 = &((wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
              UNLOCK();
            }
            else {
              ppuVar1 = &((wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
            }
          }
          ::wasm::Interpreter::addInstance
                    (local_b0,&results.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
          if (local_130 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130);
          }
          ::wasm::Interpreter::runTest((Expression *)local_80);
          wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
               = 5;
          local_f0 = 2;
          __l._M_len = 1;
          __l._M_array = (iterator)
                         &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_128,__l,
                     (allocator_type *)&local_88);
          ::wasm::Literal::~Literal
                    ((Literal *)
                     &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          testing::internal::
          CmpHelperEQ<std::vector<wasm::Literal,std::allocator<wasm::Literal>>,std::vector<wasm::Literal,std::allocator<wasm::Literal>>>
                    ((internal *)
                     &wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     "results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_128);
          if ((char)wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi == '\0') {
            testing::Message::Message(&local_88);
            if (local_f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar6 = "";
            }
            else {
              pcVar6 = (local_f8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,0x3ca,pcVar6);
            testing::internal::AssertHelper::operator=(&local_b8,&local_88);
            testing::internal::AssertHelper::~AssertHelper(&local_b8);
            if (local_88.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
                (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)local_88.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
          }
          if (local_f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_f8,local_f8);
          }
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_128);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_80);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
          std::vector<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>::
          ~vector((vector<wasm::interpreter::Instance,_std::allocator<wasm::interpreter::Instance>_>
                   *)&interpreter.store.callStack.
                      super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>::~vector
                    ((vector<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_> *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)&builder);
        goto LAB_0018fec8;
      }
      testing::Message::Message((Message *)local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)&builder,
                 (AssertionResult *)"irBuilder.visitEnd().getErr()","true","false",pcVar6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x3c0,(char *)results.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_b0);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
  if (results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (pointer)&interpreter.store.callStack.
                super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (ulong)(interpreter.store.callStack.
                            super__Vector_base<wasm::interpreter::Frame,_std::allocator<wasm::interpreter::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 1));
  }
  if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&expr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_expr
                );
  }
LAB_0018fec8:
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&irBuilder.scopeStack.
                    super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::~vector
            ((vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_> *)
             ((long)&irBuilder.debugLoc.
                     super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                     .
                     super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             + 0x10));
  if (wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

TEST(InterpreterTest, GlobalInitI32) {
  auto wasm = std::make_shared<Module>();
  Builder builder(*wasm);
  IRBuilder irBuilder(*wasm);
  wasm->addGlobal(builder.makeGlobal(
    "global",
    Type::i32,
    builder.makeBinary(
      AddInt32, builder.makeConst(int32_t(2)), builder.makeConst(int32_t(3))),
    Builder::Mutable));

  ASSERT_FALSE(
    irBuilder.makeBlock(Name{}, Signature(Type::none, Type::i32)).getErr());
  ASSERT_FALSE(irBuilder.makeGlobalGet("global").getErr());
  ASSERT_FALSE(irBuilder.visitEnd().getErr());

  auto expr = irBuilder.build();
  ASSERT_FALSE(expr.getErr());

  Interpreter interpreter;
  auto result = interpreter.addInstance(wasm);
  auto results = interpreter.runTest(*expr);
  std::vector<Literal> expected{Literal(int32_t(5))};

  EXPECT_EQ(results, expected);
}